

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalLib::ParseFader(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  FDecalFaderAnim *this_00;
  char *name;
  FDecalFaderAnim *local_48;
  FDecalFaderAnim *local_40;
  FDecalFaderAnim *fader;
  int local_28;
  int local_24;
  int decayTime;
  int startTime;
  FString faderName;
  FScanner *sc_local;
  FDecalLib *this_local;
  
  faderName.Chars = (char *)sc;
  FString::FString((FString *)&decayTime);
  local_24 = 0;
  local_28 = 0;
  FScanner::MustGetString((FScanner *)faderName.Chars);
  FString::operator=((FString *)&decayTime,*faderName.Chars);
  FScanner::MustGetStringName((FScanner *)faderName.Chars,"{");
  while( true ) {
    FScanner::MustGetString((FScanner *)faderName.Chars);
    bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"DecayStart");
    if (bVar1) {
      FScanner::MustGetFloat((FScanner *)faderName.Chars);
      local_24 = (int)(*(double *)(faderName.Chars + 0x18) * 35.0);
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"DecayTime");
      if (bVar1) {
        FScanner::MustGetFloat((FScanner *)faderName.Chars);
        local_28 = (int)(*(double *)(faderName.Chars + 0x18) * 35.0);
      }
      else {
        FScanner::ScriptError
                  ((FScanner *)faderName.Chars,"Unknown fader parameter \'%s\'",
                   *(undefined8 *)faderName.Chars);
      }
    }
  }
  this_00 = (FDecalFaderAnim *)operator_new(0x18);
  name = FString::operator_cast_to_char_((FString *)&decayTime);
  FDecalFaderAnim::FDecalFaderAnim(this_00,name);
  *(int *)&(this_00->super_FDecalAnimator).field_0xc = local_24;
  this_00->DecayTime = local_28;
  local_48 = this_00;
  local_40 = this_00;
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Push
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
             (FDecalAnimator **)&local_48);
  FString::~FString((FString *)&decayTime);
  return;
}

Assistant:

void FDecalLib::ParseFader (FScanner &sc)
{
	FString faderName;
	int startTime = 0, decayTime = 0;

	sc.MustGetString ();
	faderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			FDecalFaderAnim *fader = new FDecalFaderAnim (faderName);
			fader->DecayStart = startTime;
			fader->DecayTime = decayTime;
			Animators.Push (fader);
			break;
		}
		else if (sc.Compare ("DecayStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("DecayTime"))
		{
			sc.MustGetFloat ();
			decayTime = (int)(sc.Float * TICRATE);
		}
		else
		{
			sc.ScriptError ("Unknown fader parameter '%s'", sc.String);
		}
	}
}